

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
extract_chunk_table(exr_const_context_t ctxt,exr_const_priv_part_t part,uint64_t **chunktable,
                   uint64_t *chunkminoffset)

{
  exr_result_t eVar1;
  int iVar2;
  long lVar3;
  uint64_t uVar4;
  exr_const_context_t p_Var5;
  long *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar6;
  uint64_t cchunk;
  int ci;
  exr_result_t rv;
  uint64_t maxoff;
  int complete;
  uintptr_t nptr;
  uintptr_t eptr;
  int64_t nread;
  uint64_t chunkbytes;
  uint64_t chunkoff;
  uint64_t *ctable;
  int local_78;
  ulong local_70;
  exr_const_context_t chunktable_00;
  exr_const_priv_part_t part_00;
  ulong local_38;
  exr_const_context_t local_30;
  undefined8 *local_20;
  long local_18;
  long local_10;
  exr_result_t local_4;
  
  local_38 = *(ulong *)(in_RSI + 0xf8);
  lVar3 = (long)*(int *)(in_RSI + 0xf4) * 8;
  *in_RCX = local_38 + lVar3;
  p_Var5 = *(exr_const_context_t *)(in_RSI + 0x100);
  local_30 = p_Var5;
  local_20 = in_RDX;
  if (p_Var5 == (exr_const_context_t)0x0) {
    part_00 = (exr_const_priv_part_t)0x0;
    chunktable_00 = (exr_const_context_t)0x0;
    bVar6 = true;
    local_70 = 0xffffffffffffffff;
    if (*(int *)(in_RSI + 0xf4) < 1) {
      eVar1 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid file with no chunks");
      return eVar1;
    }
    if ((0x100000 < *(int *)(in_RSI + 0xf4)) ||
       ((0 < *(long *)(in_RDI + 0x98) && (*(ulong *)(in_RDI + 0x98) < lVar3 + local_38)))) {
      eVar1 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,3,"chunk table size (%lu) too big for file size (%ld)",lVar3,
                         *(undefined8 *)(in_RDI + 0x98));
      return eVar1;
    }
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_30 = (exr_const_context_t)(**(code **)(in_RDI + 0x58))(lVar3);
    if (local_30 == (exr_const_context_t)0x0) {
      eVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
      return eVar1;
    }
    iVar2 = (**(code **)(local_10 + 0x28))
                      (local_10,local_30,lVar3,&local_38,&stack0xffffffffffffffb0,0);
    if (iVar2 == 0) {
      if (*(char *)(local_10 + 0x220) == '\0') {
        if (0 < *(long *)(local_10 + 0x98)) {
          local_70 = *(ulong *)(local_10 + 0x98);
        }
        for (local_78 = 0; local_78 < *(int *)(local_18 + 0xf4); local_78 = local_78 + 1) {
          uVar4 = one_to_native64(0x21e76c);
          if ((uVar4 < local_38) || (local_70 <= uVar4)) {
            bVar6 = false;
          }
          *(uint64_t *)(&local_30->mode + (long)local_78 * 8) = uVar4;
        }
        if (((!bVar6) &&
            (eVar1 = reconstruct_chunk_table(p_Var5,part_00,(uint64_t *)chunktable_00), eVar1 != 0))
           && (*(char *)(local_10 + 6) != '\0')) {
          (**(code **)(local_10 + 0x60))(local_30);
          local_30 = (exr_const_context_t)0xffffffffffffffff;
          (**(code **)(local_10 + 0x40))
                    (local_10,0x16,"Incomplete / corrupt chunk table, unable to reconstruct");
        }
      }
      else {
        priv_to_native64(local_30,*(int *)(local_18 + 0xf4));
      }
    }
    else {
      (**(code **)(local_10 + 0x60))(local_30);
      local_30 = (exr_const_context_t)0xffffffffffffffff;
    }
    LOCK();
    p_Var5 = *(exr_const_context_t *)(local_18 + 0x100);
    bVar6 = chunktable_00 == p_Var5;
    if (bVar6) {
      *(exr_const_context_t *)(local_18 + 0x100) = local_30;
      p_Var5 = chunktable_00;
    }
    UNLOCK();
    if (!bVar6) {
      if (local_30 != (exr_const_context_t)0xffffffffffffffff) {
        (**(code **)(local_10 + 0x60))(local_30);
      }
      local_30 = p_Var5;
      if (p_Var5 == (exr_const_context_t)0x0) {
        eVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
        return eVar1;
      }
    }
  }
  *local_20 = local_30;
  local_4 = 0;
  if (local_30 == (exr_const_context_t)0xffffffffffffffff) {
    local_4 = 0x16;
  }
  return local_4;
}

Assistant:

exr_result_t
extract_chunk_table (
    exr_const_context_t   ctxt,
    exr_const_priv_part_t part,
    uint64_t**            chunktable,
    uint64_t*             chunkminoffset)
{
    uint64_t* ctable     = NULL;
    uint64_t  chunkoff   = part->chunk_table_offset;
    uint64_t  chunkbytes = sizeof (uint64_t) * (uint64_t) part->chunk_count;

    *chunkminoffset = chunkoff + chunkbytes;

    ctable = (uint64_t*) atomic_load (
        EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)));
    if (ctable == NULL)
    {
        int64_t      nread = 0;
        uintptr_t    eptr = 0, nptr = 0;
        int          complete = 1;
        uint64_t     maxoff   = ((uint64_t) -1);
        exr_result_t rv;

        if (part->chunk_count <= 0)
            return ctxt->report_error (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file with no chunks");

        /* some of the stream-based objects can't reliably check the file size
         * so the C++ layer also had an arbitrary stop at 2^20 chunk entries
         * which seems safe...
         */
        if (part->chunk_count > (1024 * 1024) ||
            (ctxt->file_size > 0 &&
             chunkbytes + chunkoff > (uint64_t) ctxt->file_size))
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "chunk table size (%" PRIu64 ") too big for file size (%" PRId64
                ")",
                chunkbytes,
                ctxt->file_size);

        ctable = (uint64_t*) ctxt->alloc_fn (chunkbytes);
        if (ctable == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        rv = ctxt->do_read (
            ctxt, ctable, chunkbytes, &chunkoff, &nread, EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS)
        {
            ctxt->free_fn (ctable);
            ctable = (uint64_t*) UINTPTR_MAX;
        }
        else if (!ctxt->disable_chunk_reconstruct)
        {
            // could convert table all at once, but need to check if the
            // file is incomplete (i.e. crashed during write and didn't
            // get a complete chunk table), so just do them one at a time
            if (ctxt->file_size > 0) maxoff = (uint64_t) ctxt->file_size;
            for (int ci = 0; ci < part->chunk_count; ++ci)
            {
                uint64_t cchunk = one_to_native64 (ctable[ci]);
                if (cchunk < chunkoff || cchunk >= maxoff) complete = 0;
                ctable[ci] = cchunk;
            }

            if (!complete)
            {
                // The c++ side would basically fail as soon as it
                // failed, but would otherwise swallow all errors, and
                // then just let the reads fail later. We will do
                // something similar, except when in strict mode, we
                // will fail with a corrupt chunk immediately.
                rv = reconstruct_chunk_table (ctxt, part, ctable);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (ctxt->strict_header)
                    {
                        ctxt->free_fn (ctable);
                        ctable = (uint64_t*) UINTPTR_MAX;
                        rv     = ctxt->report_error (
                            ctxt,
                            EXR_ERR_BAD_CHUNK_LEADER,
                            "Incomplete / corrupt chunk table, unable to reconstruct");
                    }
                    else
                        rv = EXR_ERR_SUCCESS;
                }
            }
        }
        else { priv_to_native64 (ctable, part->chunk_count); }

        nptr = (uintptr_t) ctable;
        // see if we win or not
        if (!atomic_compare_exchange_strong (
                EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)),
                &eptr,
                nptr))
        {
            if (nptr != UINTPTR_MAX) ctxt->free_fn (ctable);
            ctable = (uint64_t*) eptr;
            if (ctable == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
    }

    *chunktable = ctable;
    return ((uintptr_t) ctable) == UINTPTR_MAX ? EXR_ERR_BAD_CHUNK_LEADER
                                               : EXR_ERR_SUCCESS;
}